

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int sprkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  uint in_ECX;
  ARKodeMem in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeSPRKStepMem step_mem;
  int retval;
  int local_4;
  
  local_4 = sprkStep_AccessStepMem(in_RDX,(char *)((ulong)in_ECX << 0x20),(ARKodeSPRKStepMem *)0x0);
  if (local_4 == 0) {
    if (in_ECX < 3) {
      iVar1 = sprkStep_f1((ARKodeSPRKStepMem)in_RDI,(sunrealtype)in_XMM0_Qa,in_RSI,(N_Vector)in_RDX,
                          (void *)((ulong)in_ECX << 0x20));
      if (iVar1 == 0) {
        iVar1 = sprkStep_f2((ARKodeSPRKStepMem)in_RDI,(sunrealtype)in_XMM0_Qa,in_RSI,
                            (N_Vector)in_RDX,(void *)((ulong)in_ECX << 0x20));
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x1f8,"sprkStep_FullRHS",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                          ,
                          "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                         );
          local_4 = -8;
        }
      }
      else {
        arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0x1f0,"sprkStep_FullRHS",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                       );
        local_4 = -8;
      }
    }
    else {
      arkProcessError(in_RDI,-8,0x201,"sprkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"Unknown full RHS mode");
      local_4 = -8;
    }
  }
  return local_4;
}

Assistant:

int sprkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                     int mode)
{
  int retval                 = 0;
  ARKodeSPRKStepMem step_mem = NULL;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:
  case ARK_FULLRHS_END:
  case ARK_FULLRHS_OTHER:

    /* Since f1 and f2 do not have overlapping outputs and so the f vector is
       passed to both RHS functions. */

    retval = sprkStep_f1(step_mem, t, y, f, ark_mem->user_data);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    retval = sprkStep_f2(step_mem, t, y, f, ark_mem->user_data);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}